

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O0

bool __thiscall S2Loop::BoundaryApproxEquals(S2Loop *this,S2Loop *b,S1Angle max_error)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  S2Point *pSVar5;
  S2Point *pSVar6;
  int local_40;
  int i;
  bool success;
  int local_2c;
  int offset;
  S2Loop *b_local;
  S2Loop *this_local;
  S1Angle max_error_local;
  
  iVar3 = num_vertices(this);
  iVar4 = num_vertices(b);
  if (iVar3 == iVar4) {
    bVar1 = is_empty_or_full(this);
    if (bVar1) {
      bVar1 = is_empty(this);
      bVar2 = is_empty(b);
      max_error_local.radians_._7_1_ = bVar1 == bVar2;
    }
    else {
      for (local_2c = 0; iVar3 = num_vertices(this), local_2c < iVar3; local_2c = local_2c + 1) {
        pSVar5 = vertex(this,local_2c);
        pSVar6 = vertex(b,0);
        bVar1 = S2::ApproxEquals(pSVar5,pSVar6,max_error);
        if (bVar1) {
          bVar1 = true;
          for (local_40 = 0; iVar3 = num_vertices(this), local_40 < iVar3; local_40 = local_40 + 1)
          {
            pSVar5 = vertex(this,local_40 + local_2c);
            pSVar6 = vertex(b,local_40);
            bVar2 = S2::ApproxEquals(pSVar5,pSVar6,max_error);
            if (!bVar2) {
              bVar1 = false;
              break;
            }
          }
          if (bVar1) {
            return true;
          }
        }
      }
      max_error_local.radians_._7_1_ = false;
    }
  }
  else {
    max_error_local.radians_._7_1_ = false;
  }
  return max_error_local.radians_._7_1_;
}

Assistant:

bool S2Loop::BoundaryApproxEquals(const S2Loop& b, S1Angle max_error) const {
  if (num_vertices() != b.num_vertices()) return false;

  // Special case to handle empty or full loops.  Since they have the same
  // number of vertices, if one loop is empty/full then so is the other.
  if (is_empty_or_full()) return is_empty() == b.is_empty();

  for (int offset = 0; offset < num_vertices(); ++offset) {
    if (S2::ApproxEquals(vertex(offset), b.vertex(0), max_error)) {
      bool success = true;
      for (int i = 0; i < num_vertices(); ++i) {
        if (!S2::ApproxEquals(vertex(i + offset), b.vertex(i), max_error)) {
          success = false;
          break;
        }
      }
      if (success) return true;
      // Otherwise continue looping.  There may be more than one candidate
      // starting offset since vertices are only matched approximately.
    }
  }
  return false;
}